

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12.c
# Opt level: O1

int mbedtls_pkcs12_derivation
              (uchar *data,size_t datalen,uchar *pwd,size_t pwdlen,uchar *salt,size_t saltlen,
              mbedtls_md_type_t md_type,int id,int iterations)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *md_info;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  size_t __n;
  size_t sVar9;
  ulong ilen;
  uchar *p;
  void *pvVar10;
  undefined1 *__dest;
  mbedtls_md_context_t md_ctx;
  uchar hash_block [128];
  uchar pwd_block [128];
  uchar salt_block [128];
  uchar hash_output [64];
  uchar diversifier [128];
  ulong local_2b0;
  uchar *local_298;
  mbedtls_md_context_t local_290;
  undefined1 local_278 [127];
  byte abStack_1f9 [128];
  byte abStack_179 [129];
  uchar local_f8 [64];
  uchar local_b8 [136];
  
  iVar3 = -0x1f80;
  if (saltlen < 0x41 && (pwdlen < 0x41 && datalen < 0x81)) {
    md_info = mbedtls_md_info_from_type(md_type);
    if (md_info == (mbedtls_md_info_t *)0x0) {
      iVar3 = -0x1f00;
    }
    else {
      mbedtls_md_init(&local_290);
      iVar3 = mbedtls_md_setup(&local_290,md_info,0);
      if (iVar3 == 0) {
        bVar2 = mbedtls_md_get_size(md_info);
        __n = (ulong)(0x20 < bVar2) * 0x40 + 0x40;
        memset(local_b8,id,__n);
        pvVar10 = (void *)((long)abStack_179 + 1);
        sVar9 = __n;
        do {
          sVar6 = saltlen;
          if (sVar9 < saltlen) {
            sVar6 = sVar9;
          }
          memcpy(pvVar10,salt,sVar6);
          pvVar10 = (void *)((long)pvVar10 + sVar6);
          sVar9 = sVar9 - sVar6;
        } while (sVar9 != 0);
        pvVar10 = (void *)((long)abStack_1f9 + 1);
        sVar9 = __n;
        do {
          sVar6 = pwdlen;
          if (sVar9 < pwdlen) {
            sVar6 = sVar9;
          }
          memcpy(pvVar10,pwd,sVar6);
          pvVar10 = (void *)((long)pvVar10 + sVar6);
          sVar9 = sVar9 - sVar6;
        } while (sVar9 != 0);
        if (datalen == 0) {
LAB_001389db:
          iVar3 = 0;
        }
        else {
          iVar3 = mbedtls_md_starts(&local_290);
          if (iVar3 == 0) {
            ilen = (ulong)bVar2;
            local_2b0 = datalen;
            local_298 = data;
            do {
              iVar3 = mbedtls_md_update(&local_290,local_b8,__n);
              if ((((iVar3 != 0) ||
                   (iVar3 = mbedtls_md_update(&local_290,(uchar *)((long)abStack_179 + 1),__n),
                   iVar3 != 0)) ||
                  (iVar3 = mbedtls_md_update(&local_290,(uchar *)((long)abStack_1f9 + 1),__n),
                  iVar3 != 0)) || (iVar3 = mbedtls_md_finish(&local_290,local_f8), iVar3 != 0))
              break;
              lVar7 = (long)iterations + -1;
              if (1 < (uint)iterations) {
                do {
                  iVar3 = mbedtls_md(md_info,local_f8,ilen,local_f8);
                  if (iVar3 != 0) goto LAB_001389de;
                  lVar7 = lVar7 + -1;
                } while (lVar7 != 0);
              }
              uVar8 = ilen;
              if (local_2b0 < ilen) {
                uVar8 = local_2b0;
              }
              memcpy(local_298,local_f8,uVar8);
              local_2b0 = local_2b0 - uVar8;
              if (local_2b0 == 0) goto LAB_001389db;
              local_298 = local_298 + uVar8;
              __dest = local_278;
              sVar9 = __n;
              do {
                uVar8 = ilen;
                if (sVar9 < ilen) {
                  uVar8 = sVar9;
                }
                memcpy(__dest,local_f8,uVar8);
                __dest = __dest + uVar8;
                sVar9 = sVar9 - uVar8;
                sVar4 = __n;
              } while (sVar9 != 0);
              do {
                if (sVar4 == 0) break;
                pcVar1 = local_278 + (sVar4 - 1);
                *pcVar1 = *pcVar1 + '\x01';
                sVar4 = sVar4 - 1;
              } while (*pcVar1 == '\0');
              uVar5 = 0;
              sVar9 = __n;
              do {
                uVar5 = (uint)(byte)local_278[sVar9 - 1] + abStack_179[sVar9] + uVar5;
                abStack_179[sVar9] = (byte)uVar5;
                uVar5 = uVar5 >> 8;
                sVar9 = sVar9 - 1;
              } while (sVar9 != 0);
              uVar5 = 0;
              sVar9 = __n;
              do {
                uVar5 = (uint)(byte)local_278[sVar9 - 1] + abStack_1f9[sVar9] + uVar5;
                abStack_1f9[sVar9] = (byte)uVar5;
                uVar5 = uVar5 >> 8;
                sVar9 = sVar9 - 1;
              } while (sVar9 != 0);
              iVar3 = mbedtls_md_starts(&local_290);
            } while (iVar3 == 0);
          }
        }
LAB_001389de:
        mbedtls_platform_zeroize((void *)((long)abStack_179 + 1),0x80);
        mbedtls_platform_zeroize((void *)((long)abStack_1f9 + 1),0x80);
        mbedtls_platform_zeroize(local_278,0x80);
        mbedtls_platform_zeroize(local_f8,0x40);
        mbedtls_md_free(&local_290);
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_pkcs12_derivation( unsigned char *data, size_t datalen,
                       const unsigned char *pwd, size_t pwdlen,
                       const unsigned char *salt, size_t saltlen,
                       mbedtls_md_type_t md_type, int id, int iterations )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned int j;

    unsigned char diversifier[128];
    unsigned char salt_block[128], pwd_block[128], hash_block[128];
    unsigned char hash_output[MBEDTLS_MD_MAX_SIZE];
    unsigned char *p;
    unsigned char c;

    size_t hlen, use_len, v, i;

    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    // This version only allows max of 64 bytes of password or salt
    if( datalen > 128 || pwdlen > 64 || saltlen > 64 )
        return( MBEDTLS_ERR_PKCS12_BAD_INPUT_DATA );

    md_info = mbedtls_md_info_from_type( md_type );
    if( md_info == NULL )
        return( MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE );

    mbedtls_md_init( &md_ctx );

    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        return( ret );
    hlen = mbedtls_md_get_size( md_info );

    if( hlen <= 32 )
        v = 64;
    else
        v = 128;

    memset( diversifier, (unsigned char) id, v );

    pkcs12_fill_buffer( salt_block, v, salt, saltlen );
    pkcs12_fill_buffer( pwd_block,  v, pwd,  pwdlen  );

    p = data;
    while( datalen > 0 )
    {
        // Calculate hash( diversifier || salt_block || pwd_block )
        if( ( ret = mbedtls_md_starts( &md_ctx ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_update( &md_ctx, diversifier, v ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_update( &md_ctx, salt_block, v ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_update( &md_ctx, pwd_block, v ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_finish( &md_ctx, hash_output ) ) != 0 )
            goto exit;

        // Perform remaining ( iterations - 1 ) recursive hash calculations
        for( i = 1; i < (size_t) iterations; i++ )
        {
            if( ( ret = mbedtls_md( md_info, hash_output, hlen, hash_output ) ) != 0 )
                goto exit;
        }

        use_len = ( datalen > hlen ) ? hlen : datalen;
        memcpy( p, hash_output, use_len );
        datalen -= use_len;
        p += use_len;

        if( datalen == 0 )
            break;

        // Concatenating copies of hash_output into hash_block (B)
        pkcs12_fill_buffer( hash_block, v, hash_output, hlen );

        // B += 1
        for( i = v; i > 0; i-- )
            if( ++hash_block[i - 1] != 0 )
                break;

        // salt_block += B
        c = 0;
        for( i = v; i > 0; i-- )
        {
            j = salt_block[i - 1] + hash_block[i - 1] + c;
            c = (unsigned char) (j >> 8);
            salt_block[i - 1] = j & 0xFF;
        }

        // pwd_block  += B
        c = 0;
        for( i = v; i > 0; i-- )
        {
            j = pwd_block[i - 1] + hash_block[i - 1] + c;
            c = (unsigned char) (j >> 8);
            pwd_block[i - 1] = j & 0xFF;
        }
    }

    ret = 0;

exit:
    mbedtls_platform_zeroize( salt_block, sizeof( salt_block ) );
    mbedtls_platform_zeroize( pwd_block, sizeof( pwd_block ) );
    mbedtls_platform_zeroize( hash_block, sizeof( hash_block ) );
    mbedtls_platform_zeroize( hash_output, sizeof( hash_output ) );

    mbedtls_md_free( &md_ctx );

    return( ret );
}